

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,void **vtt,
          TPZGeoMesh *DestMesh,TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  void *pvVar1;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  int64_t local_80;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *local_78;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *local_70;
  void **local_68;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  local_68 = vtt + 1;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,local_68,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZGeoPoint + -4) + *(long *)((long)pvVar1 + -0x60)) =
       vtt[3];
  local_78 = this;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend(&this->fGeo,&cp->fGeo,gl2lcNdMap);
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_016b1180;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  local_70 = &this->fGeo;
  TPZGeoElSide::TPZGeoElSide(&local_60,cp->fNeighbours,(cp->super_TPZGeoEl).fMesh);
  local_80 = (local_60.fGeoEl)->fIndex;
  while( true ) {
    iVar2 = std::
            _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
            ::find(&gl2lcElMap->_M_t,&local_80);
    if ((_Rb_tree_header *)iVar2._M_node != &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header)
    break;
    TPZGeoElSide::Neighbour(&local_48,&local_60);
    local_60.fSide = local_48.fSide;
    local_80 = (local_48.fGeoEl)->fIndex;
  }
  pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](gl2lcElMap,&local_80);
  local_78->fNeighbours[0].fGeoElIndex = *pmVar3;
  local_78->fNeighbours[0].fSide = local_60.fSide;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}